

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmSwitch(ExpressionContext *ctx,VmModule *module,ExprSwitch *node)

{
  ExprBase *pEVar1;
  SynBase *pSVar2;
  VmFunction *pVVar3;
  VmBlock *block;
  VmBlock *block_00;
  VmBlock **ppVVar4;
  VmValue *pVVar5;
  VmBlock *pVVar6;
  uint index;
  IntrusiveList<ExprBase> *pIVar7;
  VmBlock *falseLabel;
  IntrusiveList<ExprBase> *pIVar8;
  uint uVar9;
  LoopInfo local_178;
  IntrusiveList<ExprBase> *local_168;
  SmallArray<VmBlock_*,_16U> conditionBlocks;
  SmallArray<VmBlock_*,_16U> caseBlocks;
  
  CompileVm(ctx,module,node->condition);
  conditionBlocks.allocator = module->allocator;
  conditionBlocks.data = conditionBlocks.little;
  conditionBlocks.count = 0;
  conditionBlocks.max = 0x10;
  caseBlocks.data = caseBlocks.little;
  caseBlocks.count = 0;
  caseBlocks.max = 0x10;
  pIVar8 = &node->cases;
  pIVar7 = pIVar8;
  caseBlocks.allocator = conditionBlocks.allocator;
  while (pEVar1 = pIVar7->head, pEVar1 != (ExprBase *)0x0) {
    local_178.breakBlock =
         anon_unknown.dwarf_f89de::CreateBlock(module,(node->super_ExprBase).source,"switch_case");
    SmallArray<VmBlock_*,_16U>::push_back(&conditionBlocks,&local_178.breakBlock);
    pIVar7 = (IntrusiveList<ExprBase> *)&pEVar1->next;
  }
  pIVar7 = &node->blocks;
  while (pEVar1 = pIVar7->head, pEVar1 != (ExprBase *)0x0) {
    local_178.breakBlock =
         anon_unknown.dwarf_f89de::CreateBlock(module,(node->super_ExprBase).source,"case_block");
    SmallArray<VmBlock_*,_16U>::push_back(&caseBlocks,&local_178.breakBlock);
    pIVar7 = (IntrusiveList<ExprBase> *)&pEVar1->next;
  }
  block = anon_unknown.dwarf_f89de::CreateBlock
                    (module,(node->super_ExprBase).source,"default_block");
  block_00 = anon_unknown.dwarf_f89de::CreateBlock
                       (module,(node->super_ExprBase).source,"switch_exit");
  pSVar2 = (node->super_ExprBase).source;
  pVVar6 = block;
  if (conditionBlocks.count != 0) {
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[](&conditionBlocks,0);
    pVVar6 = *ppVVar4;
  }
  anon_unknown.dwarf_f89de::CreateJump(module,pSVar2,&pVVar6->super_VmValue);
  uVar9 = 1;
  local_168 = &node->blocks;
  while (pIVar7 = local_168, pEVar1 = pIVar8->head, pEVar1 != (ExprBase *)0x0) {
    index = uVar9 - 1;
    pVVar3 = module->currentFunction;
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[](&conditionBlocks,index);
    VmFunction::AddBlock(pVVar3,*ppVVar4);
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[](&conditionBlocks,index);
    module->currentBlock = *ppVVar4;
    pVVar5 = CompileVm(ctx,module,pEVar1);
    pSVar2 = (node->super_ExprBase).source;
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[](&caseBlocks,index);
    pVVar6 = *ppVVar4;
    falseLabel = block;
    if (pEVar1->next != (ExprBase *)0x0) {
      ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[](&conditionBlocks,uVar9);
      falseLabel = *ppVVar4;
    }
    anon_unknown.dwarf_f89de::CreateJumpNotZero
              (module,pSVar2,pVVar5,&pVVar6->super_VmValue,&falseLabel->super_VmValue);
    uVar9 = uVar9 + 1;
    pIVar8 = (IntrusiveList<ExprBase> *)&pEVar1->next;
  }
  local_178.continueBlock = (VmBlock *)0x0;
  local_178.breakBlock = block_00;
  SmallArray<VmModule::LoopInfo,_32U>::push_back(&module->loopInfo,&local_178);
  uVar9 = 1;
  while( true ) {
    pEVar1 = pIVar7->head;
    pVVar3 = module->currentFunction;
    if (pEVar1 == (ExprBase *)0x0) break;
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[](&caseBlocks,uVar9 - 1);
    VmFunction::AddBlock(pVVar3,*ppVVar4);
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[](&caseBlocks,uVar9 - 1);
    module->currentBlock = *ppVVar4;
    CompileVm(ctx,module,pEVar1);
    pSVar2 = (node->super_ExprBase).source;
    pVVar6 = block;
    if (pEVar1->next != (ExprBase *)0x0) {
      ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[](&caseBlocks,uVar9);
      pVVar6 = *ppVVar4;
    }
    anon_unknown.dwarf_f89de::CreateJump(module,pSVar2,&pVVar6->super_VmValue);
    pIVar7 = (IntrusiveList<ExprBase> *)&pEVar1->next;
    uVar9 = uVar9 + 1;
  }
  VmFunction::AddBlock(pVVar3,block);
  module->currentBlock = block;
  if (node->defaultBlock != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->defaultBlock);
  }
  anon_unknown.dwarf_f89de::CreateJump
            (module,(node->super_ExprBase).source,&block_00->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_00);
  module->currentBlock = block_00;
  SmallArray<VmModule::LoopInfo,_32U>::pop_back(&module->loopInfo);
  pVVar5 = anon_unknown.dwarf_f89de::CreateVoid(module);
  anon_unknown.dwarf_f89de::CheckType(ctx,&node->super_ExprBase,pVVar5);
  SmallArray<VmBlock_*,_16U>::~SmallArray(&caseBlocks);
  SmallArray<VmBlock_*,_16U>::~SmallArray(&conditionBlocks);
  return pVVar5;
}

Assistant:

VmValue* CompileVmSwitch(ExpressionContext &ctx, VmModule *module, ExprSwitch *node)
{
	CompileVm(ctx, module, node->condition);

	SmallArray<VmBlock*, 16> conditionBlocks(module->allocator);
	SmallArray<VmBlock*, 16> caseBlocks(module->allocator);

	// Generate blocks for all cases
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next)
		conditionBlocks.push_back(CreateBlock(module, node->source, "switch_case"));

	// Generate blocks for all cases
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next)
		caseBlocks.push_back(CreateBlock(module, node->source, "case_block"));

	VmBlock *defaultBlock = CreateBlock(module, node->source, "default_block");
	VmBlock *exitBlock = CreateBlock(module, node->source, "switch_exit");

	CreateJump(module, node->source, conditionBlocks.empty() ? defaultBlock : conditionBlocks[0]);

	unsigned i;

	// Generate code for all conditions
	i = 0;
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next, i++)
	{
		module->currentFunction->AddBlock(conditionBlocks[i]);
		module->currentBlock = conditionBlocks[i];

		VmValue *condition = CompileVm(ctx, module, curr);

		CreateJumpNotZero(module, node->source, condition, caseBlocks[i], curr->next ? conditionBlocks[i + 1] : defaultBlock);
	}

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, NULL));

	// Generate code for all cases
	i = 0;
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next, i++)
	{
		module->currentFunction->AddBlock(caseBlocks[i]);
		module->currentBlock = caseBlocks[i];

		CompileVm(ctx, module, curr);

		CreateJump(module, node->source, curr->next ? caseBlocks[i + 1] : defaultBlock);
	}

	// Create default block
	module->currentFunction->AddBlock(defaultBlock);
	module->currentBlock = defaultBlock;

	if(node->defaultBlock)
		CompileVm(ctx, module, node->defaultBlock);
	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}